

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

UCollationResult __thiscall
icu_63::RuleBasedCollator::compare
          (RuleBasedCollator *this,UnicodeString *left,UnicodeString *right,int32_t length,
          UErrorCode *errorCode)

{
  ushort uVar1;
  ushort uVar2;
  UCollationResult UVar3;
  int leftLength;
  char16_t *left_00;
  int32_t iVar4;
  
  if ((length != 0) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (-1 < length) {
      uVar1 = (left->fUnion).fStackFields.fLengthAndFlags;
      if ((short)uVar1 < 0) {
        leftLength = (left->fUnion).fFields.fLength;
      }
      else {
        leftLength = (int)(short)uVar1 >> 5;
      }
      uVar2 = (right->fUnion).fStackFields.fLengthAndFlags;
      if ((short)uVar2 < 0) {
        iVar4 = (right->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)(short)uVar2 >> 5;
      }
      if (length <= leftLength) {
        leftLength = length;
      }
      if (iVar4 < length) {
        length = iVar4;
      }
      if (((int)(short)uVar1 & 0x11U) == 0) {
        if ((uVar1 & 2) == 0) {
          left_00 = (left->fUnion).fFields.fArray;
        }
        else {
          left_00 = (left->fUnion).fStackFields.fBuffer;
        }
      }
      else {
        left_00 = (char16_t *)0x0;
      }
      if ((uVar2 & 0x11) != 0) {
        UVar3 = doCompare(this,left_00,leftLength,(UChar *)0x0,length,errorCode);
        return UVar3;
      }
      if ((uVar2 & 2) == 0) {
        UVar3 = doCompare(this,left_00,leftLength,(right->fUnion).fFields.fArray,length,errorCode);
        return UVar3;
      }
      UVar3 = doCompare(this,left_00,leftLength,(right->fUnion).fStackFields.fBuffer,length,
                        errorCode);
      return UVar3;
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return UCOL_EQUAL;
}

Assistant:

UCollationResult
RuleBasedCollator::compare(const UnicodeString &left, const UnicodeString &right,
                           int32_t length, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode) || length == 0) { return UCOL_EQUAL; }
    if(length < 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return UCOL_EQUAL;
    }
    int32_t leftLength = left.length();
    int32_t rightLength = right.length();
    if(leftLength > length) { leftLength = length; }
    if(rightLength > length) { rightLength = length; }
    return doCompare(left.getBuffer(), leftLength,
                     right.getBuffer(), rightLength, errorCode);
}